

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O0

QVariant * __thiscall
QInputMethodQueryEvent::value(QInputMethodQueryEvent *this,InputMethodQuery query)

{
  long i_00;
  qsizetype qVar1;
  const_reference pQVar2;
  InputMethodQuery in_EDX;
  long in_RSI;
  QVariant *in_RDI;
  int i;
  QVariant *this_00;
  int local_18;
  
  local_18 = 0;
  this_00 = in_RDI;
  while( true ) {
    i_00 = (long)local_18;
    qVar1 = QList<QInputMethodQueryEvent::QueryPair>::size
                      ((QList<QInputMethodQueryEvent::QueryPair> *)(in_RSI + 0x18));
    if (qVar1 <= i_00) {
      ::QVariant::QVariant((QVariant *)0x34dc32);
      return in_RDI;
    }
    pQVar2 = QList<QInputMethodQueryEvent::QueryPair>::at
                       ((QList<QInputMethodQueryEvent::QueryPair> *)this_00,i_00);
    if (pQVar2->query == in_EDX) break;
    local_18 = local_18 + 1;
  }
  pQVar2 = QList<QInputMethodQueryEvent::QueryPair>::at
                     ((QList<QInputMethodQueryEvent::QueryPair> *)this_00,i_00);
  ::QVariant::QVariant(this_00,&pQVar2->value);
  return in_RDI;
}

Assistant:

QVariant QInputMethodQueryEvent::value(Qt::InputMethodQuery query) const
{
    for (int i = 0; i < m_values.size(); ++i)
        if (m_values.at(i).query == query)
            return m_values.at(i).value;
    return QVariant();
}